

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::
iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::revalidate_if_necessary
          (iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,TreeIterator *it)

{
  bool bVar1;
  LogMessage *other;
  const_iterator local_a8;
  iterator_base<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>> local_90 [8];
  iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  i;
  Node *l;
  byte local_59;
  LogMessage local_58;
  TreeIterator *local_20;
  TreeIterator *it_local;
  iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  local_59 = 0;
  local_20 = it;
  it_local = (TreeIterator *)this;
  if ((this->node_ == (Node *)0x0) || (this->m_ == (InnerMap *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x252);
    local_59 = 1;
    other = internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: node_ != nullptr && m_ != nullptr: ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&l + 3),other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  this->bucket_index_ = this->m_->num_buckets_ - 1 & this->bucket_index_;
  if ((Node *)this->m_->table_[this->bucket_index_] == this->node_) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = TableEntryIsNonEmptyList(this->m_,this->bucket_index_);
    if (bVar1) {
      i.bucket_index_ = (size_type)this->m_->table_[this->bucket_index_];
      do {
        i.bucket_index_ = *(long *)(i.bucket_index_ + 0x40);
        if ((Node *)i.bucket_index_ == (Node *)0x0) {
          i.bucket_index_ = 0;
          goto LAB_002b5ced;
        }
      } while ((Node *)i.bucket_index_ != this->node_);
      this_local._7_1_ = true;
    }
    else {
LAB_002b5ced:
      InnerMap::find(&local_a8,this->m_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     this->node_,local_20);
      Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::
      iterator_base<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>>::
      iterator_base<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const>
                (local_90,&local_a8);
      this->bucket_index_ = (size_type)i.m_;
      this_local._7_1_ = TableEntryIsList(this->m_,this->bucket_index_);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool revalidate_if_necessary(TreeIterator* it) {
        GOOGLE_DCHECK(node_ != nullptr && m_ != nullptr);
        // Force bucket_index_ to be in range.
        bucket_index_ &= (m_->num_buckets_ - 1);
        // Common case: the bucket we think is relevant points to node_.
        if (m_->table_[bucket_index_] == static_cast<void*>(node_)) return true;
        // Less common: the bucket is a linked list with node_ somewhere in it,
        // but not at the head.
        if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
          Node* l = static_cast<Node*>(m_->table_[bucket_index_]);
          while ((l = l->next) != nullptr) {
            if (l == node_) {
              return true;
            }
          }
        }
        // Well, bucket_index_ still might be correct, but probably
        // not.  Revalidate just to be sure.  This case is rare enough that we
        // don't worry about potential optimizations, such as having a custom
        // find-like method that compares Node* instead of the key.
        iterator_base i(m_->find(node_->kv.first, it));
        bucket_index_ = i.bucket_index_;
        return m_->TableEntryIsList(bucket_index_);
      }